

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O0

MPP_RET h265e_dpb_init(H265eDpb **dpb)

{
  H265eDpb *pHVar1;
  H265eRefPicListModification *pHVar2;
  H265eRpsList *rps_list;
  RK_U32 i;
  H265eDpb *p;
  MPP_RET ret;
  H265eDpb **dpb_local;
  
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_dpb","enter\n","h265e_dpb_init");
  }
  if (dpb == (H265eDpb **)0x0) {
    _mpp_log_l(2,"h265e_dpb","invalid parameter %p \n","h265e_dpb_init",0);
    dpb_local._4_4_ = MPP_ERR_VALUE;
  }
  else {
    pHVar1 = (H265eDpb *)mpp_osal_calloc("h265e_dpb_init",0x9e0);
    if (pHVar1 == (H265eDpb *)0x0) {
      dpb_local._4_4_ = MPP_ERR_MALLOC;
    }
    else {
      pHVar1->last_idr = 0;
      pHVar1->poc_cra = 0;
      pHVar1->max_ref_l0 = 1;
      pHVar1->max_ref_l1 = 0;
      (pHVar1->RpsList).lt_num = 0;
      (pHVar1->RpsList).st_num = 0;
      memset((pHVar1->RpsList).poc,0,0x300);
      pHVar2 = (H265eRefPicListModification *)mpp_osal_calloc("h265e_dpb_init",0x108);
      (pHVar1->RpsList).m_RefPicListModification = pHVar2;
      for (rps_list._4_4_ = 0; rps_list._4_4_ < 0x11; rps_list._4_4_ = rps_list._4_4_ + 1) {
        pHVar1->frame_list[rps_list._4_4_].slot_idx = rps_list._4_4_;
      }
      if ((dpb == (H265eDpb **)0x0) &&
         (_mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,"dpb",
                     "h265e_dpb_init",0xc9), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      *dpb = pHVar1;
      if ((h265e_debug & 1) != 0) {
        _mpp_log_l(4,"h265e_dpb","leave\n","h265e_dpb_init");
      }
      dpb_local._4_4_ = MPP_OK;
    }
  }
  return dpb_local._4_4_;
}

Assistant:

MPP_RET h265e_dpb_init(H265eDpb **dpb)
{
    MPP_RET ret = MPP_OK;
    H265eDpb *p = NULL;
    RK_U32 i;

    h265e_dbg_func("enter\n");
    if (NULL == dpb) {
        mpp_err_f("invalid parameter %p \n", dpb);
        return MPP_ERR_VALUE;
    }

    p = mpp_calloc_size(H265eDpb, sizeof(H265eDpb));

    if (NULL == p)
        return MPP_ERR_MALLOC;

    p->last_idr = 0;
    p->poc_cra = 0;
    p->max_ref_l0 = 1;
    p->max_ref_l1 = 0;

    H265eRpsList *rps_list = &p->RpsList;

    rps_list->lt_num = 0;
    rps_list->st_num = 0;

    memset(rps_list->poc, 0, sizeof(rps_list->poc));

    rps_list->m_RefPicListModification = mpp_calloc(H265eRefPicListModification, 1);


    for (i = 0; i < MPP_ARRAY_ELEMS(p->frame_list); i++)
        p->frame_list[i].slot_idx = i;

    mpp_assert(dpb);
    *dpb = p;
    h265e_dbg_func("leave\n");
    return ret;
}